

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O1

void xmlInitParserInternal(void)

{
  xmlInitRandom();
  xmlInitMemoryInternal();
  pthread_mutex_init((pthread_mutex_t *)&xmlLibraryLock,(pthread_mutexattr_t *)0x0);
  xmlLibraryLock.held = 0;
  xmlLibraryLock.waiters = 0;
  pthread_cond_init((pthread_cond_t *)&xmlLibraryLock.cv,(pthread_condattr_t *)0x0);
  xmlInitGlobalsInternal();
  xmlInitDictInternal();
  xmlInitEncodingInternal();
  xmlInitXPathInternal();
  xmlInitIOCallbacks();
  xmlInitCatalogInternal();
  xmlParserInitialized = 1;
  return;
}

Assistant:

static void
xmlInitParserInternal(void) {
    /*
     * Note that the initialization code must not make memory allocations.
     */
    xmlInitRandom(); /* Required by xmlInitGlobalsInternal */
    xmlInitMemoryInternal();
    xmlInitThreadsInternal();
    xmlInitGlobalsInternal();
    xmlInitDictInternal();
    xmlInitEncodingInternal();
#if defined(LIBXML_XPATH_ENABLED)
    xmlInitXPathInternal();
#endif
    xmlInitIOCallbacks();
#ifdef LIBXML_CATALOG_ENABLED
    xmlInitCatalogInternal();
#endif

    xmlParserInitialized = 1;
}